

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O3

void __thiscall
NodeParser::parseEmitter
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Pattern *pPVar6;
  InputError *pIVar7;
  string local_78;
  double local_58;
  double coeff;
  undefined1 local_40 [16];
  double local_30;
  double expon;
  
  if (0x20 < (ulong)((long)(tokens->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    iVar5 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar5 == 0) {
      local_58 = 0.0;
      local_30 = (nw->options).valueOptions[6];
      pbVar1 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = Utilities::parseNumber<double>(pbVar1 + 1,&local_58);
      if (!bVar4) {
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        coeff = (double)local_40;
        pcVar3 = pbVar1[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&coeff,pcVar3,pcVar3 + pbVar1[1]._M_string_length);
        InputError::InputError(pIVar7,6,(string *)&coeff);
        __cxa_throw(pIVar7,&InputError::typeinfo,ENerror::~ENerror);
      }
      iVar5 = (int)((ulong)((long)pbVar2 - (long)pbVar1) >> 5);
      if (2 < iVar5) {
        bVar4 = Utilities::parseNumber<double>(pbVar1 + 2,&local_30);
        if (!bVar4) {
          pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
          coeff = (double)local_40;
          pcVar3 = pbVar1[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&coeff,pcVar3,pcVar3 + pbVar1[2]._M_string_length);
          InputError::InputError(pIVar7,6,(string *)&coeff);
          __cxa_throw(pIVar7,&InputError::typeinfo,ENerror::~ENerror);
        }
        if (iVar5 != 3) {
          iVar5 = std::__cxx11::string::compare((char *)(pbVar1 + 3));
          if (iVar5 != 0) {
            pPVar6 = Network::pattern(nw,pbVar1 + 3);
            if (pPVar6 == (Pattern *)0x0) {
              pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
              coeff = (double)local_40;
              pcVar3 = pbVar1[3]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&coeff,pcVar3,pcVar3 + pbVar1[3]._M_string_length);
              InputError::InputError(pIVar7,5,(string *)&coeff);
              __cxa_throw(pIVar7,&InputError::typeinfo,ENerror::~ENerror);
            }
          }
        }
      }
      bVar4 = Emitter::addEmitter((Junction *)node,local_58,local_30,(Pattern *)0x0);
      if (!bVar4) {
        pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Node Emitter","");
        InputError::InputError(pIVar7,1,&local_78);
        __cxa_throw(pIVar7,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  return;
}

Assistant:

void NodeParser::parseEmitter(Node* node, Network* nw, vector<string>& tokens)
{
    // ... cast Node to Junction
    if ( tokens.size() < 2 ) return;
    if ( node->type() != Node::JUNCTION ) return;
    Junction* junc = static_cast<Junction*>(node);

    // ... read emitter's parameters
    double coeff = 0.0;
    double expon = nw->option(Options::EMITTER_EXPONENT);
    Pattern* pattern = 0;
    parseEmitterData(nw, tokens, coeff, expon, pattern);

    // ... add an emitter to the junction
    if ( !Emitter::addEmitter(junc, coeff, expon, pattern) )
    {
        throw InputError(InputError::CANNOT_CREATE_OBJECT, "Node Emitter");
    }
}